

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O3

void __thiscall UniValue::setFloat(UniValue *this,double val_)

{
  string str;
  long in_FS_OFFSET;
  ostringstream oss;
  undefined1 *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  long in_stack_fffffffffffffe60;
  long local_190;
  undefined8 local_188 [13];
  ios_base local_120 [264];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x10;
  std::ostream::_M_insert<double>(val_);
  std::__cxx11::stringbuf::str();
  str._M_string_length = (size_type)in_stack_fffffffffffffe50;
  str._M_dataplus._M_p = (pointer)val_;
  str.field_2._M_allocated_capacity = in_stack_fffffffffffffe58;
  str.field_2._8_8_ = in_stack_fffffffffffffe60;
  setNumStr(this,str);
  if (in_stack_fffffffffffffe50 != &stack0xfffffffffffffe60) {
    operator_delete(in_stack_fffffffffffffe50,in_stack_fffffffffffffe60 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::ios_base::~ios_base(local_120);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::setFloat(double val_)
{
    std::ostringstream oss;

    oss << std::setprecision(16) << val_;

    return setNumStr(oss.str());
}